

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O2

void __thiscall ser::CentralizedFileFormat::ImportTables(CentralizedFileFormat *this)

{
  FieldsTable *this_00;
  OffsetTable *this_01;
  int iVar1;
  JSONNode *pJVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  allocator local_269;
  JSONNode node;
  json_string local_260;
  string json_txt;
  ifstream fs;
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream(&fs,(this->databaseFile_)._M_dataplus._M_p,_S_in);
  json_txt._M_dataplus._M_p = (pointer)&json_txt.field_2;
  json_txt._M_string_length = 0;
  json_txt.field_2._M_local_buf[0] = '\0';
  std::istream::seekg((long)&fs,_S_beg);
  iVar1 = std::istream::tellg();
  if (iVar1 < 1) {
    std::ifstream::close();
    MetainfoSet::Cleanup((this->super_FileFormat).pGlobalMetainfo_);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
             *)(this->super_FileFormat).pFieldsTable_);
    OffsetTable::Cleanup((this->super_FileFormat).pOffsetTable_);
  }
  else {
    std::__cxx11::string::reserve((ulong)&json_txt);
    std::istream::seekg((long)&fs,_S_beg);
    __first._8_8_ = 0xffffffffffffffff;
    __first._M_sbuf = *(streambuf_type **)((long)auStack_138 + *(long *)(_fs + -0x18));
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)&json_txt,__first,
               (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
    std::ifstream::close();
    JSONWorker::parse((JSONWorker *)&node,&json_txt);
    std::__cxx11::string::string((string *)&local_260,"GlobalMetainfo",&local_269);
    pJVar2 = ::JSONNode::operator[](&node,&local_260);
    GlobalInfoFromJSON(this,pJVar2);
    std::__cxx11::string::~string((string *)&local_260);
    this_00 = (this->super_FileFormat).pFieldsTable_;
    std::__cxx11::string::string((string *)&local_260,"FieldsTable",&local_269);
    pJVar2 = ::JSONNode::operator[](&node,&local_260);
    FieldsTable::TableFromJSON(this_00,pJVar2);
    std::__cxx11::string::~string((string *)&local_260);
    this_01 = (this->super_FileFormat).pOffsetTable_;
    std::__cxx11::string::string((string *)&local_260,"OffsetTable",&local_269);
    pJVar2 = ::JSONNode::operator[](&node,&local_260);
    OffsetTable::TableFromJSON(this_01,pJVar2);
    std::__cxx11::string::~string((string *)&local_260);
    ::JSONNode::~JSONNode(&node);
  }
  std::__cxx11::string::~string((string *)&json_txt);
  std::ifstream::~ifstream(&fs);
  return;
}

Assistant:

void CentralizedFileFormat::ImportTables()
{
    // Open database file and get length
    std::ifstream fs(databaseFile_.c_str());
    std::string json_txt;
    fs.seekg(0, std::ios::end);
    int fileLength = fs.tellg();

    // If file length is 0, then do not interpret JSON and clean the tables
    if (fileLength <= 0)
    {
        fs.close();

        pGlobalMetainfo_->Cleanup();
        pFieldsTable_->Cleanup();
        pOffsetTable_->Cleanup();
        return;
    }

    // Read json
    json_txt.reserve(fileLength);
    fs.seekg(0, std::ios::beg);
    json_txt.assign((std::istreambuf_iterator<char>(fs)), std::istreambuf_iterator<char>());
    fs.close();

    // Interpret JSON
    try
    {
        JSONNode node = libjson::parse(json_txt);

        GlobalInfoFromJSON(node["GlobalMetainfo"]);
        pFieldsTable_->TableFromJSON(node["FieldsTable"]);
        pOffsetTable_->TableFromJSON(node["OffsetTable"]);
    }
    catch(std::exception&)
    {
        std::cerr << "Error: JSON code in file " << databaseFile_ << " is malformed.\n"
                  << "Unable to read data.\n";
        std::exit(1);
    }
}